

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::iterate
          (InterInvocationTestCase *this)

{
  TestContext *this_00;
  bool bVar1;
  char *pcVar2;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  InterInvocationTestCase *local_10;
  InterInvocationTestCase *this_local;
  
  local_10 = this;
  runCompute(this);
  bVar1 = verifyResults(this);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar2 = "image";
    if (this->m_storage == STORAGE_BUFFER) {
      pcVar2 = "buffer";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar2,&local_51);
    std::operator+(&local_30,&local_50," content verification failed");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,pcVar2);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return STOP;
}

Assistant:

InterInvocationTestCase::IterateResult InterInvocationTestCase::iterate (void)
{
	// Dispatch
	runCompute();

	// Verify buffer contents
	if (verifyResults())
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, (std::string((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) + " content verification failed").c_str());

	return STOP;
}